

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O1

void __thiscall slang::parsing::NumberParser::reportIntOverflow(NumberParser *this,Token token)

{
  SourceLocation location;
  Diagnostic *this_00;
  SVInt val;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_58;
  uint local_50;
  undefined1 local_4c;
  byte local_4b;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_48;
  undefined1 local_28;
  Token local_20;
  
  local_20.info = token.info;
  local_20._0_8_ = token._0_8_;
  Token::intValue((Token *)&local_48);
  SVInt::resize((SVInt *)&local_58,(bitwidth_t)&local_48);
  if (((0x40 < (uint)local_48._8_4_) || ((local_48._13_1_ & 1) != 0)) &&
     ((void *)local_48._0_8_ != (void *)0x0)) {
    operator_delete__((void *)local_48._0_8_);
  }
  local_4c = 1;
  location = Token::location(&local_20);
  this_00 = Diagnostics::add(this->diagnostics,(DiagCode)0xd0003,location);
  SVInt::SVInt((SVInt *)&local_48,(SVIntStorage *)&local_58);
  local_28 = 1;
  Diagnostic::operator<<(this_00,(ConstantValue *)&local_48);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_48);
  if (((0x40 < local_50) || ((local_4b & 1) != 0)) && ((void *)local_58.val != (void *)0x0)) {
    operator_delete__(local_58.pVal);
  }
  return;
}

Assistant:

void NumberParser::reportIntOverflow(Token token) {
    SVInt val = token.intValue().resize(32);
    val.setSigned(true);

    addDiag(diag::SignedIntegerOverflow, token.location()) << val;
}